

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getJointPos(KinDynComputations *this,Span<double,__1L> q)

{
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *pMVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  bool bVar2;
  bool ok;
  VectorDynSize *in_stack_ffffffffffffffa8;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_ffffffffffffffb0;
  
  this_00 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
            Span<double,_-1L>::size((Span<double,__1L> *)0x1c9eb6);
  pMVar1 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
           iDynTree::Model::getNrOfPosCoords();
  bVar2 = this_00 == pMVar1;
  if (bVar2) {
    iDynTree::FreeFloatingPos::jointPos();
    toEigen(in_stack_ffffffffffffffa8);
    toEigen((Span<double,__1L>)in_stack_ffffffffffffffb0);
    Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::operator=
              (this_00,in_RDI);
  }
  else {
    iDynTree::reportError("KinDynComputations","getJointPos","Wrong size in input q.");
  }
  return bVar2;
}

Assistant:

bool KinDynComputations::getJointPos(Span<double> q) const
{
    bool ok = q.size() == pimpl->m_robot_model.getNrOfPosCoords();
    if( !ok )
    {
        reportError("KinDynComputations","getJointPos","Wrong size in input q.");
        return false;
    }

    toEigen(q) = toEigen(this->pimpl->m_pos.jointPos());
    return true;
}